

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::speculateIfConditionHeuristics
          (CheckerVisitor *this,Expr *cond,VarScope *thenScope,VarScope *elseScope,
          unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
          *visited,int32_t evalId,uint flags,bool inv)

{
  float fVar1;
  long lVar2;
  int32_t iVar3;
  int iVar4;
  iterator iVar5;
  Expr *pEVar6;
  Expr *pEVar7;
  Id *pIVar8;
  Expr *pEVar9;
  Id *lvalue;
  Id *pIVar10;
  VarScope *pVVar11;
  undefined4 extraout_var_00;
  uint pf;
  Expr *pEVar12;
  uint nf;
  VarScope *pVVar13;
  Expr *pEVar14;
  BinExpr *bin;
  TreeOp TVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  VarScope *local_78;
  VarScope *local_70;
  Expr *local_68;
  int32_t local_5c;
  undefined8 local_58;
  LiteralExpr *typeLit;
  Expr *local_48;
  Expr *typeCheckee;
  Expr *nullcCheckee;
  undefined4 extraout_var;
  
  local_68 = deparen(cond);
  iVar5 = std::
          _Hashtable<const_SQCompilation::Expr_*,_const_SQCompilation::Expr_*,_std::allocator<const_SQCompilation::Expr_*>,_std::__detail::_Identity,_std::equal_to<const_SQCompilation::Expr_*>,_std::hash<const_SQCompilation::Expr_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&visited->_M_h,&local_68);
  if (iVar5.super__Node_iterator_base<const_SQCompilation::Expr_*,_false>._M_cur !=
      (__node_type *)0x0) {
    return;
  }
  local_5c = evalId;
  std::
  _Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<SQCompilation::Expr_const*&>
            ((_Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)visited,&local_68);
  TVar15 = (local_68->super_Node)._op;
  pVVar11 = this->currentScope;
  pVVar13 = thenScope;
  local_78 = elseScope;
  if (TVar15 == TO_OROR) {
    local_58 = (Expr *)CONCAT44(local_58._4_4_,(int)CONCAT71((int7)((ulong)pVVar11 >> 8),1));
    TVar15 = TO_ANDAND;
LAB_00148d58:
    if (!inv) {
LAB_00148d73:
      pVVar13 = elseScope;
      local_78 = thenScope;
    }
  }
  else {
    if (TVar15 == TO_NE) {
      TVar15 = TO_EQ;
      local_58 = (Expr *)((ulong)local_58._4_4_ << 0x20);
      goto LAB_00148d58;
    }
    if (TVar15 == TO_NOT) {
      bVar17 = !inv;
      pEVar6 = (Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj;
      iVar4 = local_5c;
      goto LAB_00148d33;
    }
    local_58 = (Expr *)((ulong)local_58._4_4_ << 0x20);
    if (inv) goto LAB_00148d73;
  }
  nullcCheckee = (Expr *)0x0;
  bVar17 = detectNullCPattern(this,TVar15,local_68,&nullcCheckee);
  iVar3 = local_5c;
  pEVar7 = local_68;
  if (bVar17) {
    if (((TVar15 & ~TO_WHILE) != TO_GE) && (TVar15 != TO_EQ)) {
      local_78 = pVVar13;
    }
    if (local_78 == (VarScope *)0x0) goto LAB_00148f8e;
    this->currentScope = local_78;
    pIVar8 = (Id *)nullcCheckee;
LAB_00148f87:
    pf = 2;
    nf = 0;
    goto LAB_00148f89;
  }
  if (TVar15 != TO_NULLC) {
    if (pVVar13 != (VarScope *)0x0 && (TVar15 == TO_CALL && local_5c == -1)) {
      this->currentScope = pVVar13;
      lVar2 = *(long *)&local_68[1].super_Node._coordinates.lineEnd;
      TVar15 = local_68[1].super_Node._op;
      for (lVar16 = 0; (ulong)TVar15 << 3 != lVar16; lVar16 = lVar16 + 8) {
        pEVar6 = deparen(*(Expr **)(lVar2 + lVar16));
        if ((pEVar6->super_Node)._op == TO_ID) {
          setValueFlags(this,pEVar6,0,2);
        }
      }
      pIVar8 = extractReceiver((Expr *)pEVar7[1].super_Node.super_ArenaObj._vptr_ArenaObj);
joined_r0x0014917e:
      if (pIVar8 != (Id *)0x0) goto LAB_00148f87;
      goto LAB_00148f8e;
    }
    if (TVar15 == TO_ID) {
      bVar18 = local_5c == -1;
      typeLit = (LiteralExpr *)CONCAT44(typeLit._4_4_,0xffffffff);
      local_58 = maybeEval(this,local_68,(int32_t *)&typeLit,false);
      iVar4 = (int)typeLit;
      bVar17 = (int)typeLit < iVar3;
      if (pVVar13 != (VarScope *)0x0 && (bVar17 || bVar18)) {
        this->currentScope = pVVar13;
        setValueFlags(this,local_68,0,2);
        this->currentScope = pVVar11;
      }
      if (((flags & 1) != 0 && local_78 != (VarScope *)0x0) && (bVar17 || bVar18)) {
        this->currentScope = local_78;
        setValueFlags(this,local_68,2,0);
        this->currentScope = pVVar11;
      }
      if (local_58 == local_68) {
        return;
      }
      bVar17 = false;
      elseScope = local_78;
      pEVar6 = local_58;
LAB_00148d33:
      speculateIfConditionHeuristics(this,pEVar6,pVVar13,elseScope,visited,iVar4,flags,bVar17);
      return;
    }
    if (TVar15 != TO_EQ) {
      if ((TVar15 != TO_GETSLOT) && (TVar15 != TO_GETFIELD)) {
        if (TVar15 - TO_3CMP < 5) {
          lvalue = (Id *)deparen((Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj);
          pIVar10 = (Id *)deparen(*(Expr **)&pEVar7[1].super_Node._coordinates);
          if ((lvalue->super_Expr).super_Node._op != TO_ID) {
            lvalue = (Id *)0x0;
          }
          pIVar8 = (Id *)0x0;
          if ((pIVar10->super_Expr).super_Node._op == TO_ID) {
            pIVar8 = pIVar10;
          }
          if (pVVar13 == (VarScope *)0x0) {
            return;
          }
          this->currentScope = pVVar13;
          if (lvalue != (Id *)0x0) {
            setValueFlags(this,&lvalue->super_Expr,0,2);
          }
          goto joined_r0x0014917e;
        }
        goto LAB_001491c6;
      }
      pEVar6 = deparen((Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj);
      pIVar8 = extractReceiver(pEVar6);
      if ((pVVar13 != (VarScope *)0x0) && (pIVar8 != (Id *)0x0)) {
        this->currentScope = pVVar13;
        setValueFlags(this,&pIVar8->super_Expr,0,2);
      }
      if (pVVar13 == (VarScope *)0x0 || TVar15 != TO_GETSLOT) goto LAB_00148f8e;
      pIVar8 = (Id *)deparen(*(Expr **)&pEVar7[1].super_Node._coordinates.lineEnd);
LAB_0014900e:
      this->currentScope = pVVar13;
      goto LAB_00148f87;
    }
    pEVar6 = deparen((Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj);
    pEVar9 = deparen(*(Expr **)&pEVar7[1].super_Node._coordinates);
    pEVar14 = (Expr *)0x0;
    if ((pEVar6->super_Node)._op == TO_LITERAL) {
      pEVar14 = pEVar6;
    }
    pEVar12 = (Expr *)0x0;
    if ((pEVar9->super_Node)._op == TO_LITERAL) {
      pEVar12 = pEVar9;
    }
    if (pEVar14 != (Expr *)0x0) {
      pEVar12 = pEVar14;
    }
    if (pEVar12 == pEVar6) {
      pEVar6 = pEVar9;
    }
    if (pEVar12 == (Expr *)0x0) {
      return;
    }
    if (*(int *)&(pEVar12->super_Node).field_0x1c == 4) {
      flags = flags | 1;
      bVar17 = false;
      elseScope = pVVar13;
      pVVar13 = local_78;
      iVar4 = local_5c;
      goto LAB_00148d33;
    }
    pIVar8 = extractReceiver(pEVar6);
    if ((pVVar13 != (VarScope *)0x0) && (pIVar8 != (Id *)0x0)) {
      this->currentScope = pVVar13;
      setValueFlags(this,&pIVar8->super_Expr,0,2);
      this->currentScope = pVVar11;
      pEVar7 = local_68;
    }
LAB_001491c6:
    typeLit = (LiteralExpr *)0x0;
    typeCheckee = (Expr *)0x0;
    bVar17 = detectTypeOfPattern(this,pEVar7,&typeCheckee,&typeLit);
    pEVar6 = typeCheckee;
    if (bVar17) {
      pIVar8 = extractReceiver(typeCheckee);
      if (pIVar8 == (Id *)0x0) {
        return;
      }
      iVar4 = strcmp((typeLit->_v).s,"null");
      if (pVVar13 != (VarScope *)0x0) {
        this->currentScope = pVVar13;
        setValueFlags(this,&pIVar8->super_Expr,(uint)((Id *)pEVar6 == pIVar8 && iVar4 == 0) * 2,
                      (uint)(iVar4 != 0) * 2);
      }
      if (local_78 != (VarScope *)0x0) {
        pf = (uint)(iVar4 == 0) * 2;
        this->currentScope = local_78;
        nf = 0;
        goto LAB_00148f89;
      }
    }
    else {
      if (TVar15 == TO_ANDAND) {
        pEVar6 = (Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj;
        local_48 = *(Expr **)&local_68[1].super_Node._coordinates;
        if (local_78 == (VarScope *)0x0) {
          pVVar11 = (VarScope *)0x0;
          local_70 = (VarScope *)0x0;
        }
        else {
          iVar4 = VarScope::copy(local_78,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
          pVVar11 = (VarScope *)CONCAT44(extraout_var,iVar4);
          iVar4 = VarScope::copy(local_78,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
          local_70 = (VarScope *)CONCAT44(extraout_var_00,iVar4);
        }
        iVar3 = local_5c;
        bVar17 = SUB81(local_58,0);
        speculateIfConditionHeuristics(this,pEVar6,pVVar13,pVVar11,visited,local_5c,flags,bVar17);
        speculateIfConditionHeuristics(this,local_48,pVVar13,local_70,visited,iVar3,flags,bVar17);
        if (local_78 != (VarScope *)0x0) {
          VarScope::intersectScopes(pVVar11,local_70);
          VarScope::copyFrom(local_78,pVVar11);
          VarScope::~VarScope(pVVar11);
          VarScope::~VarScope(local_70);
          return;
        }
        return;
      }
      if (1 < TVar15 - TO_IN) {
        return;
      }
      pEVar6 = *(Expr **)&local_68[1].super_Node._coordinates;
      pIVar8 = extractReceiver((Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj);
      if ((pVVar13 != (VarScope *)0x0) && (pIVar8 != (Id *)0x0)) {
        this->currentScope = pVVar13;
        setValueFlags(this,&pIVar8->super_Expr,0,2);
      }
      if (((TVar15 == TO_IN) && (pIVar8 = extractReceiver(pEVar6), pVVar13 != (VarScope *)0x0)) &&
         (pIVar8 != (Id *)0x0)) goto LAB_0014900e;
    }
    goto LAB_00148f8e;
  }
  pEVar6 = deparen((Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj);
  pEVar7 = deparen(*(Expr **)&pEVar7[1].super_Node._coordinates);
  if ((pEVar7->super_Node)._op != TO_LITERAL) {
    return;
  }
  nf = 2;
  switch(*(undefined4 *)&(pEVar7->super_Node).field_0x1c) {
  case 0:
    break;
  case 1:
    if (pEVar7[1].super_Node.super_ArenaObj._vptr_ArenaObj == (_func_int **)0x0)
    goto switchD_00148e07_default;
    break;
  case 2:
    fVar1 = *(float *)&pEVar7[1].super_Node.super_ArenaObj._vptr_ArenaObj;
    if ((fVar1 == 0.0) && (!NAN(fVar1))) goto switchD_00148e07_default;
    break;
  case 3:
    bVar17 = false;
    pf = 0;
    if (*(char *)&pEVar7[1].super_Node.super_ArenaObj._vptr_ArenaObj == '\x01') break;
    goto LAB_00149046;
  default:
switchD_00148e07_default:
    bVar17 = false;
    pf = 0;
    goto LAB_00149046;
  }
  pf = 2;
  bVar17 = true;
  nf = 0;
LAB_00149046:
  pIVar8 = extractReceiver(pEVar6);
  if (pIVar8 != (Id *)0x0) {
    if (pVVar13 != (VarScope *)0x0 && !bVar17) {
      this->currentScope = pVVar13;
      setValueFlags(this,&pIVar8->super_Expr,pf,nf);
    }
    if (bVar17 && local_78 != (VarScope *)0x0) {
      this->currentScope = local_78;
LAB_00148f89:
      setValueFlags(this,&pIVar8->super_Expr,nf,pf);
    }
LAB_00148f8e:
    this->currentScope = pVVar11;
  }
  return;
}

Assistant:

void CheckerVisitor::speculateIfConditionHeuristics(const Expr *cond, VarScope *thenScope, VarScope *elseScope, std::unordered_set<const Expr *> &visited, int32_t evalId, unsigned flags, bool inv) {
  cond = deparen(cond);

  if (visited.find(cond) != visited.end()) {
    return;
  }

  visited.emplace(cond);

  enum TreeOp op = cond->op();

  VarScope *thisScope = currentScope;

  if (op == TO_NOT) {
    const UnExpr *u = static_cast<const UnExpr *>(cond);
    return speculateIfConditionHeuristics(u->argument(), thenScope, elseScope, visited, evalId, flags, !inv);
  }

  bool invertLR = false;
  if (op == TO_NE) {
    op = TO_EQ;
    inv = !inv;
  } else if (op == TO_OROR) {
    // apply a || b <==> !(!a && !b)
    op = TO_ANDAND;
    invertLR = true;
    inv = !inv;
  }

  if (inv) {
    std::swap(thenScope, elseScope);
  }

  const Expr *nullcCheckee = nullptr;
  if (detectNullCPattern(op, cond, nullcCheckee)) {
    // (o?.f ?? D) == V -- assume else-branch implies `o` non-null
    // (o?.f ?? D) > V -- then-b implies `o` non-null
    // (o?.f ?? D) < V -- then-b implies `o` non-null

    if (op == TO_LE || op == TO_GE) {
      if (elseScope) {
        currentScope = elseScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    } else if (op == TO_EQ) {
      if (elseScope) {
        currentScope = elseScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    }
    else {
      assert(op == TO_LT || op == TO_GT);
      if (thenScope) {
        currentScope = thenScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519
    return;
  }

  if (op == TO_NULLC) {
    // o?.f ?? false
    // o?.f ?? true
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    if (rhs->op() != TO_LITERAL) { // -V522
      return;
    }

    const LiteralExpr *lit = rhs->asLiteral();
    bool nullCond;
    switch (lit->kind())
    {
    case LK_BOOL:
      nullCond = rhs->asLiteral()->b();
      break;
    case LK_NULL:
      nullCond = false;
      break;
    case LK_INT:
      nullCond = lit->i() != 0;
      break;
    case LK_FLOAT:
      nullCond = lit->f() != 0.0f;
      break;
    case LK_STRING:
      nullCond = true;
      break;
    default:
      assert(0 && "unknown literal kind");
      break;
    }

    unsigned pf, nf;

    if (nullCond) {
      pf = RT_NULL;
      nf = 0;
    }
    else {
      pf = 0;
      nf = RT_NULL;
    }

    const Expr *receiver = extractReceiver(lhs);

    if (!receiver)
      return;

    if (thenScope && !nullCond) {
      currentScope = thenScope;
      setValueFlags(receiver, pf, nf);
    }

    if (elseScope && nullCond) {
      currentScope = elseScope;
      setValueFlags(receiver, nf, pf); // -V764
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (evalId == -1 && op == TO_CALL && thenScope) {
    // if condition looks like `if (foo(x)) x.bar()` consider call as null check
    currentScope = thenScope;
    const CallExpr *call = cond->asCallExpr();
    for (auto parg : call->arguments()) {
      auto arg = deparen(parg);
      if (arg->op() == TO_ID) { // -V522
        setValueFlags(arg, 0, RT_NULL);
      }
    }

    const Expr *callee = extractReceiver(call->callee());
    if (callee) {
      setValueFlags(callee, 0, RT_NULL);
    }

    currentScope = thisScope; // -V519
    return;
  }

  if (op == TO_ID) {
    int32_t evalIndex = -1;
    const Expr *eval = maybeEval(cond, evalIndex);

    bool notOverriden = evalId == -1 || evalIndex < evalId;

    if (thenScope && notOverriden) {
      // set iff it was explicit check like `if (o) { .. }`
      // otherwise there could be complexities, see intersected_assignment.nut
      currentScope = thenScope;
      setValueFlags(cond, 0, RT_NULL);
      currentScope = thisScope;
    }

    if (elseScope && notOverriden && (flags & NULL_CHECK_F)) {
      // set NULL iff it was explicit null check `if (o == null) { ... }` otherwise it could not be null, see w233_inc_in_for.nut
      currentScope = elseScope;
      setValueFlags(cond, RT_NULL, 0);
      currentScope = thisScope;
    }

    if (eval != cond) {
      // let cond = x != null
      // if (cond) { ... }
      speculateIfConditionHeuristics(eval, thenScope, elseScope, visited, evalIndex, flags, false);
    }
    return;
  }

  if (op == TO_GETSLOT || op == TO_GETFIELD) {
    // x?[y]
    const AccessExpr *acc = static_cast<const AccessExpr *>(cond);
    const Expr *reciever = extractReceiver(deparen(acc->receiver()));

    if (reciever && thenScope) {
      currentScope = thenScope;
      setValueFlags(reciever, 0, RT_NULL);
    }

    if (op == TO_GETSLOT) {
      const Expr *key = deparen(acc->asGetSlot()->key());
      if (thenScope) {
        currentScope = thenScope;
        setValueFlags(key, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (op == TO_EQ) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    const LiteralExpr *lhs_lit = lhs->op() == TO_LITERAL ? lhs->asLiteral() : nullptr; // -V522
    const LiteralExpr *rhs_lit = rhs->op() == TO_LITERAL ? rhs->asLiteral() : nullptr; // -V522

    const LiteralExpr *lit = lhs_lit ? lhs_lit : rhs_lit;
    const Expr *testee = lit == lhs ? rhs : lhs;

    if (!lit)
      return;

    if (lit->kind() == LK_NULL) {
      speculateIfConditionHeuristics(testee, elseScope, thenScope, visited, evalId, flags | NULL_CHECK_F, false);
      return;
    }

    const Expr *receiver = extractReceiver(testee);

    if (receiver && thenScope) {
      currentScope = thenScope;
      setValueFlags(receiver, 0, RT_NULL);
      currentScope = thisScope;
    }

  }

  if (isRelationOperator(op)) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    const Id *lhs_id = lhs->op() == TO_ID ? lhs->asId() : nullptr; // -V522
    const Id *rhs_id = rhs->op() == TO_ID ? rhs->asId() : nullptr; // -V522

    if (thenScope) {
      currentScope = thenScope;
      if (lhs_id) {
        setValueFlags(lhs_id, 0, RT_NULL);
      }
      if (rhs_id) {
        setValueFlags(rhs_id, 0, RT_NULL);
      }
      currentScope = thisScope;
    }
    return;
  }

  const LiteralExpr *typeLit = nullptr;
  const Expr *typeCheckee = nullptr;

  if (detectTypeOfPattern(cond, typeCheckee, typeLit)) {
    assert(typeCheckee && typeLit);

    const Id *checkeeId = extractReceiver(typeCheckee);
    if (!checkeeId)
      return;

    bool nullCheck = strcmp(typeLit->s(), _SC("null")) == 0; // todo: should it be more precise in case of avaliable names
    bool accessCheck = typeCheckee != checkeeId;

    // if it's null check we could know for sure that true-branch implies NULL and false-branch implies NON_NULL
    // if it's not a null check we could only guarantee that true-branch implies NON_NULL
    unsigned pt = 0, nt = 0, pe = 0, ne = 0;

    if (nullCheck) {
      if (accessCheck) {
        ne = RT_NULL;
      }
      else {
        pt = RT_NULL;
        ne = RT_NULL;
      }
    }
    else {
      nt = RT_NULL;
    }

    if (thenScope) {
      currentScope = thenScope;
      setValueFlags(checkeeId, pt, nt);
    }
    if (elseScope) {
      currentScope = elseScope;
      setValueFlags(checkeeId, pe, ne);
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (op == TO_ANDAND) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = bin->lhs();
    const Expr *rhs = bin->rhs();

    VarScope *lhsEScope = nullptr;
    VarScope *rhsEScope = nullptr;

    // In '&&' operator all effects of the left-hand side work for the right side as well
    if (elseScope) {
      lhsEScope = elseScope->copy(arena);
      rhsEScope = elseScope->copy(arena);
    }

    speculateIfConditionHeuristics(lhs, thenScope, lhsEScope, visited, evalId, flags, invertLR);
    speculateIfConditionHeuristics(rhs, thenScope, rhsEScope, visited, evalId, flags, invertLR);

    if (elseScope) {
      // In contrast in `false`-branch there is no such integral effect, all we could say is something common of both side so
      // to compute that `common` part intersect lhs with rhs
      lhsEScope->intersectScopes(rhsEScope); // -V522
      elseScope->copyFrom(lhsEScope);

      lhsEScope->~VarScope();
      rhsEScope->~VarScope();
    }

    return;
  }

  if (op == TO_INSTANCEOF || op == TO_IN) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = bin->lhs();
    const Expr *rhs = bin->rhs();

    const Expr *checkee = extractReceiver(lhs);

    if (checkee && thenScope) {
      currentScope = thenScope;
      setValueFlags(checkee, 0, RT_NULL);
    }

    if (op == TO_IN) {
      checkee = extractReceiver(rhs);
      if (checkee && thenScope) {
        currentScope = thenScope;
        setValueFlags(checkee, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519

    return;
  }
}